

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O1

ExtractElementInst * LLVMBC::dyn_cast<LLVMBC::ExtractElementInst>(Value *value)

{
  ValueKind VVar1;
  ExtractElementInst *this;
  ExtractElementInst *pEVar2;
  
  if (value != (Value *)0x0) {
    this = (ExtractElementInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pEVar2 = (ExtractElementInst *)0x0;
    if (VVar1 == ExtractElement) {
      pEVar2 = this;
    }
    return pEVar2;
  }
  return (ExtractElementInst *)0x0;
}

Assistant:

inline const T *dyn_cast(const Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
		return nullptr;
}